

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O0

Gnuplot * __thiscall Gnuplot::cmd(Gnuplot *this,string *cmdstr)

{
  char *__s;
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  string *local_20;
  string *cmdstr_local;
  Gnuplot *this_local;
  
  if ((this->valid & 1U) != 0) {
    local_20 = cmdstr;
    cmdstr_local = (string *)this;
    std::operator+(local_40,(char *)cmdstr);
    __s = (char *)std::__cxx11::string::c_str();
    fputs(__s,(FILE *)this->gnucmd);
    std::__cxx11::string::~string((string *)local_40);
    fflush((FILE *)this->gnucmd);
    lVar1 = std::__cxx11::string::find((char *)local_20,0x1080e6);
    if (lVar1 == -1) {
      lVar1 = std::__cxx11::string::find((char *)local_20,0x1080ed);
      if (lVar1 == -1) {
        lVar1 = std::__cxx11::string::find((char *)local_20,0x1080e8);
        if (lVar1 != -1) {
          this->two_dim = true;
          this->nplots = this->nplots + 1;
        }
      }
      else {
        this->two_dim = false;
        this->nplots = this->nplots + 1;
      }
    }
  }
  return this;
}

Assistant:

Gnuplot& Gnuplot::cmd(const std::string &cmdstr) {
  if (!(valid)) {
    return *this;
  }

  // int fputs ( const char * str, FILE * stream );
  // writes the string str to the stream.
  // The function begins copying from the address specified (str) until it
  // reaches the terminating null character ('\0'). This final
  // null-character is not copied to the stream.
  fputs((cmdstr + "\n").c_str(), gnucmd);

  // int fflush ( FILE * stream );
  // If the given stream was open for writing and the last i/o operation was
  // an output operation, any unwritten data in the output buffer is written
  // to the file.  If the argument is a null pointer, all open files are
  // flushed.  The stream remains open after this call.
  fflush(gnucmd);

  if (cmdstr.find("replot") != std::string::npos) {
    return *this;
  } else if (cmdstr.find("splot") != std::string::npos) {
    two_dim = false;
    nplots++;
  } else if (cmdstr.find("plot") != std::string::npos) {
    two_dim = true;
    nplots++;
  }

  return *this;
}